

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTensors.h
# Opt level: O1

void __thiscall
chrono::ChVoightTensor<double>::Rotate(ChVoightTensor<double> *this,ChMatrix33<double> *Rot)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  type tmp;
  ChMatrix33<double> T;
  DstEvaluatorType dstEvaluator;
  undefined8 uStack_150;
  assign_op<double,_double> local_141;
  SrcEvaluatorType local_140;
  double local_110;
  double local_108;
  double local_100;
  Matrix<double,_3,_3,_1,_3,_3> local_f8;
  plainobjectbase_evaluator_data<double,_3> local_b0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_a8;
  undefined1 local_88 [16];
  double local_78;
  undefined1 local_70 [16];
  double local_60;
  undefined1 local_58 [16];
  double local_48;
  
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->super_ChVectorN<double,_6>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  local_140.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs = &local_f8;
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (this->super_ChVectorN<double,_6>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (this->super_ChVectorN<double,_6>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (this->super_ChVectorN<double,_6>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (this->super_ChVectorN<double,_6>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (this->super_ChVectorN<double,_6>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  local_a8.m_src = &local_140;
  local_140.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 3;
  local_b0.data = (double *)local_88;
  local_a8.m_dst = (DstEvaluatorType *)&local_b0;
  local_a8.m_functor = &local_141;
  uStack_150 = 0x84efd0;
  local_140.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs = &Rot->super_Matrix<double,_3,_3,_1,_3,_3>;
  local_140.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)Rot;
  local_140.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
         local_140.
         super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_rhs;
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5];
  local_a8.m_dstExpr = (DstXprType *)local_b0.data;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_a8);
  lVar4 = 0x10;
  do {
    uVar1 = *(undefined8 *)
             ((long)(Rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + lVar4 + -0x10);
    auVar5._8_8_ = uVar1;
    auVar5._0_8_ = uVar1;
    auVar5 = vmulpd_avx512vl(local_88,auVar5);
    uVar1 = *(undefined8 *)
             ((long)(Rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + lVar4 + -8);
    auVar2._8_8_ = uVar1;
    auVar2._0_8_ = uVar1;
    auVar5 = vfmadd231pd_avx512vl(auVar5,local_70,auVar2);
    uVar1 = *(undefined8 *)
             ((long)(Rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + lVar4);
    auVar3._8_8_ = uVar1;
    auVar3._0_8_ = uVar1;
    auVar5 = vfmadd231pd_avx512vl(auVar5,local_58,auVar3);
    *(undefined1 (*) [16])((long)&uStack_150 + lVar4) = auVar5;
    *(double *)
     ((long)&local_140.
             super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs + lVar4) =
         local_78 *
         *(double *)
          ((long)(Rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          + lVar4 + -0x10) +
         local_48 *
         *(double *)
          ((long)(Rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          + lVar4) +
         local_60 *
         *(double *)
          ((long)(Rot->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          + lVar4 + -8);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x58);
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[0] =
       (double)local_140.
               super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs;
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[1] =
       (double)local_140.
               super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_innerDim;
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[2] = local_100;
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[3] =
       (double)local_140.
               super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_rhsImpl.
               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
               data;
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[4] = local_110;
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[5] = local_108;
  return;
}

Assistant:

void Rotate(ChMatrix33<Real> Rot) {
        ChMatrix33<Real> T;
        // do  T'= R*T*R'
        ConvertToMatrix(T);
        T = Rot * T * Rot.transpose();
        ConvertFromMatrix(T);  // to do, more efficient: unroll matrix multiplications and exploit T symmetry
    }